

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_timidity_mididevice.cpp
# Opt level: O0

void __thiscall
TimidityWaveWriterMIDIDevice::~TimidityWaveWriterMIDIDevice(TimidityWaveWriterMIDIDevice *this)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  int local_1c;
  int iStack_18;
  DWORD size;
  long pos;
  TimidityWaveWriterMIDIDevice *this_local;
  
  (this->super_TimidityMIDIDevice).super_SoftSynthMIDIDevice.super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__TimidityWaveWriterMIDIDevice_009f1168;
  pos = (long)this;
  if (this->File != (FILE *)0x0) {
    _iStack_18 = ftell((FILE *)this->File);
    local_1c = iStack_18 + -8;
    iVar1 = fseek((FILE *)this->File,4,0);
    if ((iVar1 == 0) && (sVar2 = fwrite(&local_1c,4,1,(FILE *)this->File), sVar2 == 1)) {
      local_1c = iStack_18 + -0x44;
      iVar1 = fseek((FILE *)this->File,0x38,1);
      if ((iVar1 == 0) && (sVar2 = fwrite(&local_1c,4,1,(FILE *)this->File), sVar2 == 1)) {
        fclose((FILE *)this->File);
        goto LAB_00420de8;
      }
    }
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    Printf("Could not finish writing wave file: %s\n",pcVar4);
    fclose((FILE *)this->File);
  }
LAB_00420de8:
  TimidityMIDIDevice::~TimidityMIDIDevice(&this->super_TimidityMIDIDevice);
  return;
}

Assistant:

TimidityWaveWriterMIDIDevice::~TimidityWaveWriterMIDIDevice()
{
	if (File != NULL)
	{
		long pos = ftell(File);
		DWORD size;

		// data chunk size
		size = LittleLong(DWORD(pos - 8));
		if (0 == fseek(File, 4, SEEK_SET))
		{
			if (1 == fwrite(&size, 4, 1, File))
			{
				size = LittleLong(DWORD(pos - 12 - sizeof(FmtChunk) - 8));
				if (0 == fseek(File, 4 + sizeof(FmtChunk) + 4, SEEK_CUR))
				{
					if (1 == fwrite(&size, 4, 1, File))
					{
						fclose(File);
						return;
					}
				}
			}
		}
		Printf("Could not finish writing wave file: %s\n", strerror(errno));
		fclose(File);
	}
}